

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O2

int json_print_attrs(lyout *out,int level,lyd_node *node,lys_module *wdmod)

{
  lyd_attr *plVar1;
  char *__s2;
  ly_ctx *ctx;
  uint uVar2;
  int iVar3;
  int *piVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  lyd_attr **pplVar10;
  
  piVar4 = __errno_location();
  *piVar4 = 0;
  uVar2 = level * 2;
  if (wdmod != (lys_module *)0x0) {
    ly_print(out,"%*s\"%s:default\":\"true\"",(ulong)uVar2,"",wdmod->name);
    pcVar9 = ",";
    if (node->attr == (lyd_attr *)0x0) {
      pcVar9 = "";
    }
    pcVar8 = "\n";
    if (level == 0) {
      pcVar8 = "";
    }
    ly_print(out,"%s%s",pcVar9,pcVar8);
  }
  pplVar10 = &node->attr;
  pcVar9 = "\n";
  if (level == 0) {
    pcVar9 = "";
  }
  while( true ) {
    plVar1 = *pplVar10;
    if (plVar1 == (lyd_attr *)0x0) break;
    if (plVar1->annotation != (lys_ext_instance_complex *)0x0) {
      plVar5 = lys_main_module(plVar1->annotation->module);
      plVar6 = lys_main_module(node->schema->module);
      if (plVar5 == plVar6) {
        ly_print(out,"%*s\"%s\":",(ulong)uVar2,"",plVar1->name);
      }
      else {
        ly_print(out,"%*s\"%s:%s\":",(ulong)uVar2,"",plVar1->annotation->module->name,plVar1->name);
      }
      switch(plVar1->value_type) {
      case LY_TYPE_BINARY:
      case LY_TYPE_BITS:
      case LY_TYPE_DEC64:
      case LY_TYPE_ENUM:
      case LY_TYPE_INST:
      case LY_TYPE_STRING:
      case LY_TYPE_INT64:
      case LY_TYPE_UINT64:
        json_print_string(out,plVar1->value_str);
        break;
      case LY_TYPE_BOOL:
      case LY_TYPE_INT8:
      case LY_TYPE_UINT8:
      case LY_TYPE_INT16:
      case LY_TYPE_UINT16:
      case LY_TYPE_INT32:
      case LY_TYPE_UINT32:
        pcVar8 = plVar1->value_str;
        if (*pcVar8 == '\0') {
          pcVar8 = "null";
        }
        ly_print(out,"%s",pcVar8);
        break;
      case LY_TYPE_EMPTY:
        ly_print(out,"[null]");
        break;
      case LY_TYPE_IDENT:
        pcVar8 = plVar1->value_str;
        pcVar7 = strchr(pcVar8,0x3a);
        if (pcVar7 == (char *)0x0) {
          __assert_fail("p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_json.c"
                        ,0x73,
                        "int json_print_attrs(struct lyout *, int, const struct lyd_node *, const struct lys_module *)"
                       );
        }
        __s2 = plVar1->annotation->module->name;
        iVar3 = strncmp(pcVar8,__s2,(long)pcVar7 - (long)pcVar8);
        if ((iVar3 == 0) && (__s2[(long)pcVar7 - (long)pcVar8] == '\0')) {
          pcVar8 = pcVar7 + 1;
        }
        json_print_string(out,pcVar8);
        break;
      default:
        ly_log(node->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_json.c"
               ,0x84);
        goto LAB_001913d2;
      }
      pcVar8 = ",";
      if (plVar1->next == (lyd_attr *)0x0) {
        pcVar8 = "";
      }
      ly_print(out,"%s%s",pcVar8,pcVar9);
    }
    pplVar10 = &plVar1->next;
  }
  if (*piVar4 == 0) {
    iVar3 = 0;
  }
  else {
    ctx = node->schema->module->ctx;
    pcVar9 = strerror(*piVar4);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar9);
LAB_001913d2:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
json_print_attrs(struct lyout *out, int level, const struct lyd_node *node, const struct lys_module *wdmod)
{
    struct lyd_attr *attr;
    size_t len;
    char *p;

    LY_PRINT_SET;

    if (wdmod) {
        ly_print(out, "%*s\"%s:default\":\"true\"", LEVEL, INDENT, wdmod->name);
        ly_print(out, "%s%s", node->attr ? "," : "", (level ? "\n" : ""));
    }
    for (attr = node->attr; attr; attr = attr->next) {
        if (!attr->annotation) {
            /* skip exception for the NETCONF's attribute since JSON is not defined for NETCONF */
            continue;
        }
        if (lys_main_module(attr->annotation->module) != lys_main_module(node->schema->module)) {
            ly_print(out, "%*s\"%s:%s\":", LEVEL, INDENT, attr->annotation->module->name, attr->name);
        } else {
            ly_print(out, "%*s\"%s\":", LEVEL, INDENT, attr->name);
        }
        /* leafref is not supported */
        switch (attr->value_type) {
        case LY_TYPE_BINARY:
        case LY_TYPE_STRING:
        case LY_TYPE_BITS:
        case LY_TYPE_ENUM:
        case LY_TYPE_INST:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT64:
        case LY_TYPE_DEC64:
            json_print_string(out, attr->value_str);
            break;

        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_BOOL:
            ly_print(out, "%s", attr->value_str[0] ? attr->value_str : "null");
            break;

        case LY_TYPE_IDENT:
            p = strchr(attr->value_str, ':');
            assert(p);
            len = p - attr->value_str;
            if (!strncmp(attr->value_str, attr->annotation->module->name, len)
                    && !attr->annotation->module->name[len]) {
                /* do not print the prefix, it is the default prefix for this node */
                json_print_string(out, ++p);
            } else {
                json_print_string(out, attr->value_str);
            }
            break;

        case LY_TYPE_EMPTY:
            ly_print(out, "[null]");
            break;

        default:
            /* error */
            LOGINT(node->schema->module->ctx);
            return EXIT_FAILURE;
        }

        ly_print(out, "%s%s", attr->next ? "," : "", (level ? "\n" : ""));
    }

    LY_PRINT_RET(node->schema->module->ctx);
}